

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

void __thiscall KMaxDistance::copyVals(KMaxDistance *this,MaxRec *src,MaxRec *dst)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = src->numVals;
  if (uVar1 == dst->numVals) {
    for (uVar2 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar2; uVar2 = uVar2 + 1) {
      dst->vals[uVar2] = src->vals[uVar2];
    }
    dst->sumVals = src->sumVals;
    return;
  }
  fwrite("ERROR: size mismatch in copyVals.\n",0x22,1,_stderr);
  exit(1);
}

Assistant:

void KMaxDistance::copyVals( const MaxRec *src, MaxRec *dst ){
    if ( src->numVals != dst->numVals ){ fprintf(stderr, "ERROR: size mismatch in copyVals.\n"); exit(1); }
    for ( int i = 0; i < src->numVals; ++i ) dst->vals[i] = src->vals[i];
    dst->sumVals = src->sumVals;
}